

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddWindow.c
# Opt level: O2

int ddPermuteWindow3(DdManager *table,int x)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar4 = table->keys - table->isolated;
  iVar2 = x + 1;
  iVar1 = cuddSwapInPlace(table,x,iVar2);
  if (iVar1 < iVar4) {
    if (iVar1 == 0) {
      return 0;
    }
    iVar3 = 2;
    iVar4 = iVar1;
  }
  else {
    iVar3 = 1;
  }
  iVar1 = cuddSwapInPlace(table,iVar2,x + 2);
  if (iVar1 < iVar4) {
    if (iVar1 == 0) {
      return 0;
    }
    iVar3 = 3;
    iVar4 = iVar1;
  }
  iVar1 = cuddSwapInPlace(table,x,iVar2);
  if (iVar1 < iVar4) {
    if (iVar1 == 0) {
      return 0;
    }
    iVar3 = 4;
    iVar4 = iVar1;
  }
  iVar1 = cuddSwapInPlace(table,iVar2,x + 2);
  if (iVar1 < iVar4) {
    if (iVar1 == 0) {
      return 0;
    }
    iVar3 = 5;
    iVar4 = iVar1;
  }
  iVar2 = cuddSwapInPlace(table,x,iVar2);
  if (iVar2 < iVar4) {
    if (iVar2 == 0) {
      return 0;
    }
    return 6;
  }
  iVar2 = (*(code *)(&DAT_008e6564 + *(int *)(&DAT_008e6564 + (ulong)(iVar3 - 1) * 4)))();
  return iVar2;
}

Assistant:

static int
ddPermuteWindow3(
  DdManager * table,
  int  x)
{
    int y,z;
    int size,sizeNew;
    int best;

#ifdef DD_DEBUG
    assert(table->dead == 0);
    assert(x+2 < table->size);
#endif

    size = table->keys - table->isolated;
    y = x+1; z = y+1;

    /* The permutation pattern is:
    ** (x,y)(y,z)
    ** repeated three times to get all 3! = 6 permutations.
    */
#define ABC 1
    best = ABC;

#define BAC 2
    sizeNew = cuddSwapInPlace(table,x,y);
    if (sizeNew < size) {
        if (sizeNew == 0) return(0);
        best = BAC;
        size = sizeNew;
    }
#define BCA 3
    sizeNew = cuddSwapInPlace(table,y,z);
    if (sizeNew < size) {
        if (sizeNew == 0) return(0);
        best = BCA;
        size = sizeNew;
    }
#define CBA 4
    sizeNew = cuddSwapInPlace(table,x,y);
    if (sizeNew < size) {
        if (sizeNew == 0) return(0);
        best = CBA;
        size = sizeNew;
    }
#define CAB 5
    sizeNew = cuddSwapInPlace(table,y,z);
    if (sizeNew < size) {
        if (sizeNew == 0) return(0);
        best = CAB;
        size = sizeNew;
    }
#define ACB 6
    sizeNew = cuddSwapInPlace(table,x,y);
    if (sizeNew < size) {
        if (sizeNew == 0) return(0);
        best = ACB;
        size = sizeNew;
    }

    /* Now take the shortest route to the best permuytation.
    ** The initial permutation is ACB.
    */
    switch(best) {
    case BCA: if (!cuddSwapInPlace(table,y,z)) return(0);
    case CBA: if (!cuddSwapInPlace(table,x,y)) return(0);
    case ABC: if (!cuddSwapInPlace(table,y,z)) return(0);
    case ACB: break;
    case BAC: if (!cuddSwapInPlace(table,y,z)) return(0);
    case CAB: if (!cuddSwapInPlace(table,x,y)) return(0);
               break;
    default: return(0);
    }

#ifdef DD_DEBUG
    assert(table->keys - table->isolated == (unsigned) size);
#endif

    return(best);

}